

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedFieldWrapper<unsigned_int>::Clear
          (RepeatedFieldWrapper<unsigned_int> *this,Field *data)

{
  RepeatedField<unsigned_int> *this_00;
  
  this_00 = (RepeatedField<unsigned_int> *)(**(code **)(*(long *)this + 0x88))();
  RepeatedField<unsigned_int>::Clear(this_00);
  return;
}

Assistant:

void Clear(Field* data) const override {
    MutableRepeatedField(data)->Clear();
  }